

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void testTranslationRotationMatrix<float>(M44d *mat)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  void *pvVar4;
  long lVar5;
  undefined8 extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> to;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> from;
  M44d m1;
  M44d m2;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> local_248;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> local_228;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  undefined1 local_1e8 [16];
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  Vec3<double> local_198;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  float fStack_130;
  undefined4 uStack_12c;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ",0x28);
  Imath_3_2::operator<<((ostream *)&std::cout,mat);
  if (testTranslationRotationMatrix<float>(Imath_3_2::Matrix44<double>const&)::rand == '\0') {
    testTranslationRotationMatrix<float>();
  }
  local_228.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::reserve
            (&local_228,7);
  local_248.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = 7;
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::reserve
            (&local_248,7);
  do {
    local_1f8 = (double)Imath_3_2::erand48(testTranslationRotationMatrix<float>::rand._state);
    local_208 = (double)Imath_3_2::erand48(testTranslationRotationMatrix<float>::rand._state);
    uStack_200 = extraout_XMM0_Qb;
    local_1d8 = (double)Imath_3_2::erand48(testTranslationRotationMatrix<float>::rand._state);
    local_168 = mat->x[0][0];
    dStack_160 = mat->x[0][1];
    local_178 = mat->x[1][0];
    dStack_170 = mat->x[1][1];
    local_148 = mat->x[2][0];
    dStack_140 = mat->x[2][1];
    local_1e8 = *(undefined1 (*) [16])mat->x[3];
    local_1b8 = mat->x[0][2];
    local_1c8 = mat->x[1][2];
    local_1c0 = mat->x[2][2];
    dVar8 = mat->x[3][2];
    local_1a0 = mat->x[0][3];
    local_1b0 = mat->x[1][3];
    local_1a8 = mat->x[2][3];
    local_158 = mat->x[3][3];
    uStack_150 = 0;
    local_138._0_4_ = (float)local_1f8;
    local_138._4_4_ = (float)local_208;
    fStack_130 = (float)local_1d8;
    dStack_1d0 = extraout_XMM0_Qb_00;
    std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
    emplace_back<Imath_3_2::Vec3<float>>
              ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_228,
               (Vec3<float> *)&local_138);
    auVar9._0_8_ = local_158 + local_1a8 * local_1d8 + local_1a0 * local_1f8 + local_1b0 * local_208
    ;
    auVar6._0_8_ = (double)local_1e8._0_8_ +
                   local_1d8 * local_148 + local_1f8 * local_168 + local_208 * local_178;
    auVar6._8_8_ = (double)local_1e8._8_8_ +
                   local_1d8 * dStack_140 + local_1f8 * dStack_160 + local_208 * dStack_170;
    auVar9._8_8_ = auVar9._0_8_;
    auVar6 = divpd(auVar6,auVar9);
    local_138 = (double)CONCAT44((float)auVar6._8_8_,(float)auVar6._0_8_);
    fStack_130 = (float)((dVar8 + local_1c0 * local_1d8 +
                                  local_1b8 * local_1f8 + local_1c8 * local_208) / auVar9._0_8_);
    std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
    emplace_back<Imath_3_2::Vec3<float>>
              ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_248,
               (Vec3<float> *)&local_138);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  pvVar4 = operator_new(0x1c);
  auVar19 = _DAT_00169db0;
  auVar9 = _DAT_00169da0;
  auVar6 = _DAT_001602a0;
  lVar5 = 0;
  do {
    auVar11._8_4_ = (int)lVar5;
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar13 = (auVar11 | auVar19) ^ auVar6;
    if (auVar13._4_4_ == -0x80000000 && auVar13._0_4_ < -0x7ffffff9) {
      *(undefined4 *)((long)pvVar4 + lVar5 * 4) = 0x3f800000;
      *(undefined4 *)((long)pvVar4 + lVar5 * 4 + 4) = 0x3f800000;
    }
    auVar11 = (auVar11 | auVar9) ^ auVar6;
    if (auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7ffffff9) {
      *(undefined4 *)((long)pvVar4 + lVar5 * 4 + 8) = 0x3f800000;
      *(undefined4 *)((long)pvVar4 + lVar5 * 4 + 0xc) = 0x3f800000;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 8);
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_138,
             (Vec3 *)local_228.
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             &(local_248.
               super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->x,(ulong)pvVar4,true);
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_b8,
             (Vec3 *)local_228.
                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (ulong)local_248.
                    super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,true);
  lVar5 = 8;
  while( true ) {
    dVar7 = (double)*(float *)((long)local_228.
                                     super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8);
    dVar10 = (double)*(float *)((long)local_228.
                                      super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar5 + -4);
    dVar8 = (double)*(float *)((long)&(local_228.
                                       super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->x + lVar5);
    dVar16 = (double)*(float *)((long)&(local_248.
                                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->x + lVar5);
    dVar14 = dStack_e0 * dVar8 + dStack_120 * dVar7 + dStack_100 * dVar10 + dStack_c0;
    auVar12._8_8_ = dVar14;
    auVar12._0_8_ = dVar14;
    uVar1 = *(undefined8 *)
             ((long)local_248.
                    super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8);
    dVar17 = (double)(float)uVar1;
    dVar18 = (double)(float)((ulong)uVar1 >> 0x20);
    auVar19._0_8_ = local_78 * dVar8 + local_b8 * dVar7 + local_98 * dVar10 + local_58;
    auVar19._8_8_ = dStack_70 * dVar8 + dStack_b0 * dVar7 + dStack_90 * dVar10 + dStack_50;
    dVar15 = local_68 * dVar8 + local_a8 * dVar7 + local_88 * dVar10 + local_48;
    dVar3 = dVar8 * local_60 + dVar7 * local_a0 + dVar10 * local_80 + local_40;
    local_198.z = dVar16 - (local_e8 * dVar8 + local_128 * dVar7 + local_108 * dVar10 + local_c8) /
                           dVar14;
    auVar13._0_8_ = dVar8 * local_f8 + dVar7 * local_138 + dVar10 * local_118 + local_d8;
    auVar13._8_8_ =
         dVar8 * dStack_f0 + dVar7 * (double)CONCAT44(uStack_12c,fStack_130) + dVar10 * dStack_110 +
         dStack_d0;
    auVar6 = divpd(auVar13,auVar12);
    local_198.x = dVar17 - auVar6._0_8_;
    local_198.y = dVar18 - auVar6._8_8_;
    dVar8 = local_198.z * local_198.z + local_198.x * local_198.x + local_198.y * local_198.y;
    if (dVar8 < 4.450147717014403e-308) {
      uStack_200 = 0;
      local_208 = dVar3;
      local_1f8 = dVar16;
      local_1e8 = auVar19;
      local_1d8 = dVar17;
      dStack_1d0 = dVar18;
      dVar8 = Imath_3_2::Vec3<double>::lengthTiny(&local_198);
      dVar16 = local_1f8;
      dVar17 = local_1d8;
      dVar18 = dStack_1d0;
      auVar19 = local_1e8;
      dVar3 = local_208;
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    if (9.999999747378752e-05 <= dVar8) {
      __assert_fail("(b - b1).length () < eps",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0x3b,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = float]")
      ;
    }
    auVar2._8_4_ = SUB84(dVar3,0);
    auVar2._0_8_ = dVar3;
    auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
    auVar6 = divpd(auVar19,auVar2);
    local_198.x = dVar17 - auVar6._0_8_;
    local_198.y = dVar18 - auVar6._8_8_;
    local_198.z = dVar16 - dVar15 / dVar3;
    dVar8 = local_198.z * local_198.z + local_198.x * local_198.x + local_198.y * local_198.y;
    if (dVar8 < 4.450147717014403e-308) {
      dVar8 = Imath_3_2::Vec3<double>::lengthTiny(&local_198);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    if (9.999999747378752e-05 <= dVar8) break;
    lVar5 = lVar5 + 0xc;
    if (lVar5 == 0x5c) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  OK\n",5);
      operator_delete(pvVar4,0x1c);
      if (local_248.
          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228.
          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("(b - b2).length () < eps",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                ,0x3c,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = float]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t           numPoints = 7;
    std::vector<Vec> from;
    from.reserve (numPoints);
    std::vector<Vec> to;
    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (
            rand.nextf (), rand.nextf (), rand.nextf ());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec (a));
        to.push_back (Vec (b));
    }

    std::vector<T>                       weights (numPoints, T (1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (
        &from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 =
        procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof (T) == 8 ? T(1e-8) : T(1e-4);
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a  = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b  = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length () < eps);
        assert ((b - b2).length () < eps);
    }
    std::cout << "  OK\n";
}